

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module_util.cc
# Opt level: O2

PackedFunc *
tvm::runtime::WrapPackedFunc
          (PackedFunc *__return_storage_ptr__,BackendPackedCFunc faddr,
          shared_ptr<tvm::runtime::ModuleNode> *sptr_to_self)

{
  undefined8 *puVar1;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  BackendPackedCFunc local_30;
  __shared_ptr<tvm::runtime::ModuleNode,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  local_30 = faddr;
  std::__shared_ptr<tvm::runtime::ModuleNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_28,
             &sptr_to_self->super___shared_ptr<tvm::runtime::ModuleNode,_(__gnu_cxx::_Lock_policy)2>
            );
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  puVar1 = (undefined8 *)operator_new(0x18);
  *puVar1 = local_30;
  std::__shared_ptr<tvm::runtime::ModuleNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<tvm::runtime::ModuleNode,_(__gnu_cxx::_Lock_policy)2> *)(puVar1 + 1),
             &local_28);
  pcStack_40 = std::
               _Function_handler<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/module_util.cc:68:21)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/module_util.cc:68:21)>
             ::_M_manager;
  local_58._M_unused._M_object = puVar1;
  std::function<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*)>::function
            (&__return_storage_ptr__->body_,
             (function<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*)> *)&local_58);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

PackedFunc WrapPackedFunc(BackendPackedCFunc faddr,
                          const std::shared_ptr<ModuleNode> &sptr_to_self) {
  return PackedFunc([faddr, sptr_to_self](TVMArgs args, TVMRetValue *rv) {
    int ret = (*faddr)(
        const_cast<TVMValue *>(args.values),
        const_cast<int *>(args.type_codes),
        args.num_args);
    CHECK_EQ(ret, 0) << TVMGetLastError();
  });
}